

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O1

complex<double> * c8mat_test(int n)

{
  complex<double> *__s;
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  double __x;
  double dVar6;
  double dVar7;
  double dVar8;
  
  uVar4 = (ulong)(uint)(n * n) << 4;
  __s = (complex<double> *)operator_new__(uVar4);
  if (n != 0) {
    memset(__s,0,uVar4);
  }
  if (0 < n) {
    __x = (double)n;
    lVar5 = (long)__s->_M_value + 8;
    lVar2 = (ulong)(uint)n * 0x10;
    uVar4 = 0;
    do {
      iVar1 = 0;
      lVar3 = 0;
      do {
        dVar8 = ((double)iVar1 * 6.283185307179586) / __x;
        dVar6 = cexp(dVar8 * 0.0);
        dVar7 = SQRT(__x);
        if (__x < 0.0) {
          dVar7 = sqrt(__x);
        }
        *(double *)(lVar5 + lVar3 + -8) = dVar6 / dVar7;
        *(double *)(lVar5 + lVar3) = dVar8 / dVar7;
        lVar3 = lVar3 + 0x10;
        iVar1 = iVar1 + (int)uVar4;
      } while (lVar2 != lVar3);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + lVar2;
    } while (uVar4 != (uint)n);
  }
  return __s;
}

Assistant:

complex <double> *c8mat_test ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    C8MAT_TEST returns a test matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Output, complex <double> C8MAT_TEST[N*N], the matrix.
//
{
  complex <double> *a;
  double angle;
  complex <double> I = complex <double> ( 0.0, 1.0 );
  int i;
  int j;
  double pi = 3.141592653589793;

  a = new complex <double>[n*n];

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < n; i++ )
    {
      angle = 2.0 * pi * static_cast<double>(i * j) / static_cast<double>(n);

      a[i+j*n] = exp ( I * angle ) / sqrt ( static_cast<double>(n) );
    }
  }
  return a;
}